

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::advance_past_deleted
          (sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *this)

{
  const_nonempty_iterator *pppVar1;
  sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *psVar2;
  sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *psVar3;
  
  while ((((((this->pos).row_begin._M_current != (this->end).row_begin._M_current ||
            (psVar2 = (this->pos).row_end._M_current, psVar2 != (this->end).row_end._M_current)) ||
           (psVar3 = (this->pos).row_current._M_current,
           psVar3 != (this->end).row_current._M_current)) ||
          ((psVar3 != psVar2 && ((this->pos).col_current != (this->end).col_current)))) &&
         ((this->ht->num_deleted != 0 &&
          ((this->ht->key_info).delkey.i_ == (((this->pos).col_current)->first).i_))))) {
    pppVar1 = &(this->pos).col_current;
    *pppVar1 = *pppVar1 + 1;
    const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>_>
    ::advance_past_end(&this->pos);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }